

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  uint8_t uVar1;
  char *pcVar2;
  size_t sVar3;
  uint8_t *puVar4;
  uint32_t i_1;
  _Elt_pointer pPVar5;
  uint uVar6;
  _Map_pointer ppPVar7;
  uint uVar8;
  ulong uVar9;
  ulong nanos;
  Packet *pPVar10;
  _Elt_pointer pPVar11;
  long lVar12;
  int iVar13;
  uint8_t i;
  long lVar14;
  uint64_t n;
  Packet *this;
  unique_ptr<ixy::IxyDevice,_std::default_delete<ixy::IxyDevice>_> dev;
  deque<ixy::Packet,_std::allocator<ixy::Packet>_> buffer;
  shared_ptr<ixy::Mempool> pool;
  device_stats stats1;
  device_stats stats1_old;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [8];
  _Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_> local_e8;
  Packet *local_98;
  shared_ptr<ixy::Mempool> local_90;
  device_stats local_80;
  device_stats local_58;
  
  if (argc != 2) {
    pcVar2 = *argv;
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1141b0);
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," generates packets on a single port.",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
    pcVar2 = *argv;
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1141b0);
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," <pci bus id1>",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    return 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,argv[1],(allocator<char> *)&local_80);
  ixy::ixy_init((string *)local_100,(uint16_t)&local_e8,1);
  if ((iterator *)local_e8._M_impl.super__Deque_impl_data._M_map !=
      &local_e8._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(local_e8._M_impl.super__Deque_impl_data._M_map,
                    (ulong)((long)&(local_e8._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                   addr_virt + 1));
  }
  ixy::Mempool::allocate((Mempool *)&local_90,0x800,0);
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = (Packet *)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_last = (Packet *)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_cur = (Packet *)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>::_M_initialize_map(&local_e8,0);
  ixy::Mempool::alloc_pkt_batch
            (&local_90,(deque<ixy::Packet,_std::allocator<ixy::Packet>_> *)&local_e8,0x800,0x3c);
  local_98 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pPVar10 = local_e8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppPVar7 = local_e8._M_impl.super__Deque_impl_data._M_start._M_node;
  this = local_e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (local_e8._M_impl.super__Deque_impl_data._M_start._M_cur !=
      local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    do {
      n = 0;
      do {
        uVar1 = "\x01\x02\x03\x04\x05\x06\x10\x10\x10\x10\x10\x10\b"[n];
        puVar4 = ixy::Packet::at(this,n);
        *puVar4 = uVar1;
        n = n + 1;
      } while (n != 0x2d);
      lVar14 = 0;
      uVar8 = 0;
      do {
        uVar6 = *(ushort *)(this->addr_virt + lVar14 * 2 + 0xe) + uVar8;
        uVar8 = (uVar6 & 0xffff) + 1;
        if (uVar6 < 0x10000) {
          uVar8 = uVar6;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 10);
      puVar4 = ixy::Packet::at(this,0x18);
      *puVar4 = (uint8_t)(~uVar8 >> 8);
      puVar4 = ixy::Packet::at(this,0x19);
      *puVar4 = (uint8_t)~uVar8;
      this = this + 1;
      if (this == pPVar10) {
        this = ppPVar7[1];
        ppPVar7 = ppPVar7 + 1;
        pPVar10 = this + 10;
      }
    } while (this != local_98);
  }
  std::deque<ixy::Packet,_std::allocator<ixy::Packet>_>::~deque
            ((deque<ixy::Packet,_std::allocator<ixy::Packet>_> *)&local_e8);
  local_80.dev = (IxyDevice *)local_100._0_8_;
  local_80.rx_pkts = 0;
  local_80.tx_pkts = 0;
  local_80.rx_bytes = 0;
  local_80.tx_bytes = 0;
  (*(*(_func_int ***)local_100._0_8_)[9])();
  local_58.dev = (IxyDevice *)local_100._0_8_;
  local_58.rx_pkts = 0;
  local_58.tx_pkts = 0;
  local_58.rx_bytes = 0;
  local_58.tx_bytes = 0;
  (*(*(_func_int ***)local_100._0_8_)[9])();
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_map_size = 0;
  iVar13 = 0;
  std::_Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>::_M_initialize_map(&local_e8,0);
  local_100._8_8_ = 0;
  auStack_f0 = (undefined1  [8])0x0;
  clock_gettime(1,(timespec *)(local_100 + 8));
  lVar14 = local_100._8_8_ * 1000000000 + (long)auStack_f0;
  uVar9 = 0;
  do {
    ixy::Mempool::alloc_pkt_batch
              (&local_90,(deque<ixy::Packet,_std::allocator<ixy::Packet>_> *)&local_e8,0x20,0x3c);
    pPVar5 = local_e8._M_impl.super__Deque_impl_data._M_start._M_cur;
    pPVar11 = local_e8._M_impl.super__Deque_impl_data._M_start._M_last;
    ppPVar7 = local_e8._M_impl.super__Deque_impl_data._M_start._M_node;
    while (pPVar5 != local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      *(int *)(pPVar5->addr_virt + 0x38) = iVar13;
      pPVar5 = pPVar5 + 1;
      if (pPVar5 == pPVar11) {
        pPVar5 = ppPVar7[1];
        ppPVar7 = ppPVar7 + 1;
        pPVar11 = pPVar5 + 10;
      }
      iVar13 = iVar13 + 1;
    }
    (*(*(_func_int ***)local_100._0_8_)[7])(local_100._0_8_,0,&local_e8);
    if ((uVar9 & 0xfff) == 0) {
      local_100._8_8_ = 0;
      auStack_f0 = (undefined1  [8])0x0;
      clock_gettime(1,(timespec *)(local_100 + 8));
      lVar12 = local_100._8_8_ * 1000000000 + (long)auStack_f0;
      nanos = lVar12 - lVar14;
      if (1000000000 < nanos) {
        (*(*(_func_int ***)local_100._0_8_)[8])(local_100._0_8_,&local_80);
        ixy::device_stats::print_stats_diff(&local_58,&local_80,nanos);
        local_58.rx_pkts = local_80.rx_pkts;
        local_58.tx_pkts = local_80.tx_pkts;
        local_58.rx_bytes = local_80.rx_bytes;
        local_58.tx_bytes = local_80.tx_bytes;
        lVar14 = lVar12;
      }
    }
    uVar9 = uVar9 + 1;
    std::deque<ixy::Packet,_std::allocator<ixy::Packet>_>::clear
              ((deque<ixy::Packet,_std::allocator<ixy::Packet>_> *)&local_e8);
  } while( true );
}

Assistant:

auto main(int argc, char *argv[]) -> int {
    if (argc != 2) {
        std::cout << argv[0] << " generates packets on a single port." << std::endl;
        std::cout << "Usage: " << argv[0] << " <pci bus id1>" << std::endl;
        return 1;
    }

    auto dev = ixy_init(argv[1], 1, 1);

    auto pool = Mempool::allocate(NUM_PACKETS, 0);

    // pre-fill all packet buffer in the pool with data and return them to the packet pool
    {
        std::deque<Packet> buffer;

        Mempool::alloc_pkt_batch(pool, buffer, NUM_PACKETS, PACKET_SIZE);

        for (auto &p : buffer) {
            for (uint8_t i = 0; i < sizeof(pkt_data); i++) {
                p.at(i) = pkt_data[i];
            }

            auto checksum = calc_ip_checksum(p.get_virt_addr() + 14, 20);

            p.at(24) = (checksum >> 8);
            p.at(25) = (checksum & 0xff);
        }
    }

    struct device_stats stats1{*dev}, stats1_old{*dev};

    std::deque<Packet> buffer;
    uint64_t counter = 0;
    uint32_t seq_num = 0;

    auto last_stats_printed = monotonic_time();

    while (true) {
        // re-fill our packet queue with new packets to send out
        Mempool::alloc_pkt_batch(pool, buffer, BATCH_SIZE, PACKET_SIZE);

        // update sequence number of all packets (and checksum if necessary)
        for (auto &p : buffer) {
            *(uint32_t *) (p.get_virt_addr() + PACKET_SIZE - 4) = seq_num++;
        }

        dev->tx_batch(0, buffer);

        // don't poll the time unnecessarily
        if ((counter++ & 0xfff) == 0) {
            auto time = monotonic_time();
            if (time - last_stats_printed > 1000 * 1000 * 1000) {
                // every second
                dev->read_stats(stats1);
                stats1_old.print_stats_diff(stats1, time - last_stats_printed);
                stats1_old = stats1;

                last_stats_printed = time;
            }
        }

        buffer.clear();
    }
}